

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O3

void __thiscall
slang::syntax::ProceduralDeassignStatementSyntax::setChild
          (ProceduralDeassignStatementSyntax *this,size_t index,TokenOrSyntax child)

{
  (*(code *)(&DAT_004c427c + *(int *)(&DAT_004c427c + index * 4)))();
  return;
}

Assistant:

void ProceduralDeassignStatementSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: label = child.node() ? &child.node()->as<NamedLabelSyntax>() : nullptr; return;
        case 1: attributes = child.node()->as<SyntaxList<AttributeInstanceSyntax>>(); return;
        case 2: keyword = child.token(); return;
        case 3: variable = child.node() ? &child.node()->as<ExpressionSyntax>() : nullptr; return;
        case 4: semi = child.token(); return;
        default: SLANG_UNREACHABLE;
    }
}